

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ModSystem.cpp
# Opt level: O3

void __thiscall
RenX_ModSystemPlugin::RenX_OnAdminLogout
          (RenX_ModSystemPlugin *this,Server *server,PlayerInfo *player)

{
  list<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_> *plVar1;
  long *plVar2;
  size_type sVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  _List_node_base *p_Var7;
  const_iterator __end1;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  basic_string_view<char,_std::char_traits<char>_> lhs_00;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  basic_string_view<char,_std::char_traits<char>_> rhs_00;
  
  plVar1 = &this->groups;
  if ((this->groups).
      super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
      ._M_impl._M_node._M_size == 0) {
    iVar6 = 0;
  }
  else {
    iVar6 = *(int *)&(plVar1->
                     super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
                     )._M_impl._M_node.super__List_node_base._M_next[1]._M_prev;
  }
  plVar2 = (long *)(player->adminType)._M_dataplus._M_p;
  sVar3 = (player->adminType)._M_string_length;
  p_Var7 = (_List_node_base *)plVar1;
  if (sVar3 == 9) {
    if ((char)plVar2[1] != 'r' || *plVar2 != 0x6f74617265646f6d) goto LAB_0010eb8c;
    pcVar4 = (this->m_moderatorGroup)._M_dataplus._M_p;
    sVar3 = (this->m_moderatorGroup)._M_string_length;
    do {
      p_Var7 = p_Var7->_M_next;
      if (p_Var7 == (_List_node_base *)plVar1) {
        iVar6 = 1;
        goto LAB_0010eb8c;
      }
      lhs_00._M_str = (char *)p_Var7[6]._M_next;
      lhs_00._M_len = (size_t)p_Var7[6]._M_prev;
      rhs_00._M_str = pcVar4;
      rhs_00._M_len = sVar3;
      bVar5 = jessilib::equalsi<char,char>(lhs_00,rhs_00);
    } while (!bVar5);
  }
  else {
    if ((sVar3 != 0xd) ||
       (*(long *)((long)plVar2 + 5) != 0x726f746172747369 || *plVar2 != 0x7473696e696d6461))
    goto LAB_0010eb8c;
    pcVar4 = (this->m_administratorGroup)._M_dataplus._M_p;
    sVar3 = (this->m_administratorGroup)._M_string_length;
    do {
      p_Var7 = (((_List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
                  *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var7 == (_List_node_base *)plVar1) {
        iVar6 = 2;
        goto LAB_0010eb8c;
      }
      lhs._M_str = (char *)p_Var7[6]._M_next;
      lhs._M_len = (size_t)p_Var7[6]._M_prev;
      rhs._M_str = pcVar4;
      rhs._M_len = sVar3;
      bVar5 = jessilib::equalsi<char,char>(lhs,rhs);
    } while (!bVar5);
  }
  iVar6 = *(int *)&p_Var7[1]._M_prev;
LAB_0010eb8c:
  if (player->access <= iVar6) {
    if ((this->groups).
        super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
        ._M_impl._M_node._M_size == 0) {
      iVar6 = 0;
    }
    else {
      iVar6 = *(int *)&(plVar1->
                       super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
                       )._M_impl._M_node.super__List_node_base._M_next[1]._M_prev;
    }
    player->access = iVar6;
  }
  return;
}

Assistant:

void RenX_ModSystemPlugin::RenX_OnAdminLogout(RenX::Server &server, const RenX::PlayerInfo &player) {
	ModGroup *group = nullptr;
	int access = RenX_ModSystemPlugin::groups.size() == 0 ? 0 : RenX_ModSystemPlugin::groups.front().access;
	if (player.adminType == game_administrator_name)
	{
		access = 2;
		group = getGroupByName(m_administratorGroup);
	}
	else if (player.adminType == game_moderator_name)
	{
		access = 1;
		group = getGroupByName(m_moderatorGroup);
	}
	if (group != nullptr)
		access = group->access;

	if (player.access <= access)
	{
		if (RenX_ModSystemPlugin::groups.size() == 0)
			player.access = 0;
		else
			player.access = RenX_ModSystemPlugin::groups.front().access;
	}
}